

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

llama_sampler * llama_sampler_init_infill(llama_vocab *vocab)

{
  undefined8 *__n;
  llama_sampler *plVar1;
  undefined8 in_RDI;
  llama_sampler_context_t in_stack_ffffffffffffffa8;
  llama_sampler_i *in_stack_ffffffffffffffb0;
  allocator_type *in_stack_ffffffffffffffc0;
  allocator_type *__a;
  vector<char,_std::allocator<char>_> *this;
  allocator_type local_1d [20];
  allocator<char> local_9;
  undefined8 local_8;
  
  local_8 = in_RDI;
  __n = (undefined8 *)operator_new(0x38);
  *__n = local_8;
  this = (vector<char,_std::allocator<char>_> *)(__n + 1);
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(this,(size_type)__n,in_stack_ffffffffffffffc0);
  __a = local_1d;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(this,(size_type)__n,__a);
  plVar1 = llama_sampler_init(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::allocator<char>::~allocator(local_1d);
  std::allocator<char>::~allocator(&local_9);
  return plVar1;
}

Assistant:

struct llama_sampler * llama_sampler_init_infill(const struct llama_vocab * vocab) {
    return llama_sampler_init(
        /* .iface = */ &llama_sampler_infill_i,
        /* .ctx   = */ new llama_sampler_infill {
            /* .vocab = */ vocab,
            /* .buf0  = */ std::vector<char>(512),
            /* .buf1  = */ std::vector<char>(512),
        }
    );
}